

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O2

bool deqp::gls::StateQueryUtil::checkError(ResultCollector *result,CallLogWrapper *gl,char *msg)

{
  GLenum GVar1;
  allocator<char> local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  GLenum local_28;
  
  GVar1 = glu::CallLogWrapper::glGetError(gl);
  if (GVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,msg,&local_b1);
    std::operator+(&local_90,&local_50,": glGetError() returned ");
    local_30 = glu::getErrorName;
    local_28 = GVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_b0,&local_30);
    std::operator+(&local_70,&local_90,&local_b0);
    tcu::ResultCollector::fail(result,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return GVar1 == 0;
}

Assistant:

static bool checkError (tcu::ResultCollector& result, glu::CallLogWrapper& gl, const char* msg)
{
	const glw::GLenum errorCode = gl.glGetError();

	if (errorCode == GL_NO_ERROR)
		return true;

	result.fail(std::string(msg) + ": glGetError() returned " + glu::getErrorStr(errorCode).toString());
	return false;
}